

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_depset_r(ly_ctx *ctx,ly_set *dep_set,lys_glob_unres *unres)

{
  lys_module *mod_00;
  uint local_5c;
  uint32_t i;
  lys_module *mod;
  lysf_ctx fctx;
  LY_ERR ret;
  lys_glob_unres *unres_local;
  ly_set *dep_set_local;
  ly_ctx *ctx_local;
  
  fctx.ext_set.field_2._4_4_ = 0;
  memset(&mod,0,0x20);
  mod = (lys_module *)ctx;
  for (local_5c = 0; local_5c < dep_set->count; local_5c = local_5c + 1) {
    mod_00 = (lys_module *)(dep_set->field_2).dnodes[local_5c];
    if (mod_00->to_compile != '\0') {
      if (mod_00->implemented == '\0') {
        __assert_fail("mod->implemented",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                      ,0x5fa,
                      "LY_ERR lys_compile_depset_r(struct ly_ctx *, struct ly_set *, struct lys_glob_unres *)"
                     );
      }
      lysc_module_free((lysf_ctx *)&mod,mod_00->compiled);
      mod_00->compiled = (lysc_module *)0x0;
      fctx.ext_set.field_2._4_4_ = lys_compile(mod_00,&unres->ds_unres);
      if (fctx.ext_set.field_2._4_4_ != LY_SUCCESS) goto LAB_00163da0;
      fctx.ext_set.field_2._4_4_ = 0;
    }
  }
  fctx.ext_set.field_2._4_4_ = lys_compile_unres_depset(ctx,unres);
  if (fctx.ext_set.field_2._4_4_ == LY_ERECOMPILE) {
    lys_compile_unres_depset_erase(ctx,unres);
    ctx_local._4_4_ = lys_compile_depset_r(ctx,dep_set,unres);
  }
  else {
    if (fctx.ext_set.field_2._4_4_ == LY_SUCCESS) {
      for (local_5c = 0; local_5c < dep_set->count; local_5c = local_5c + 1) {
        *(undefined1 *)((long)&(dep_set->field_2).dnodes[local_5c][2].schema + 1) = 0;
      }
    }
LAB_00163da0:
    if (fctx.mod._4_4_ != 0) {
      __assert_fail("!fctx.ext_set.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x616,
                    "LY_ERR lys_compile_depset_r(struct ly_ctx *, struct ly_set *, struct lys_glob_unres *)"
                   );
    }
    lys_compile_unres_depset_erase(ctx,unres);
    ctx_local._4_4_ = fctx.ext_set.field_2._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_depset_r(struct ly_ctx *ctx, struct ly_set *dep_set, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysf_ctx fctx = {.ctx = ctx};
    struct lys_module *mod;
    uint32_t i;

    for (i = 0; i < dep_set->count; ++i) {
        mod = dep_set->objs[i];
        if (!mod->to_compile) {
            /* skip */
            continue;
        }
        assert(mod->implemented);

        /* free the compiled module, if any */
        lysc_module_free(&fctx, mod->compiled);
        mod->compiled = NULL;

        /* (re)compile the module */
        LY_CHECK_GOTO(ret = lys_compile(mod, &unres->ds_unres), cleanup);
    }

    /* resolve dep set unres */
    ret = lys_compile_unres_depset(ctx, unres);
    if (ret == LY_ERECOMPILE) {
        /* new module is implemented, discard current dep set unres and recompile the whole dep set */
        lys_compile_unres_depset_erase(ctx, unres);
        return lys_compile_depset_r(ctx, dep_set, unres);
    } else if (ret) {
        /* error */
        goto cleanup;
    }

    /* success, unset the flags of all the modules in the dep set */
    for (i = 0; i < dep_set->count; ++i) {
        mod = dep_set->objs[i];
        mod->to_compile = 0;
    }

cleanup:
    assert(!fctx.ext_set.count);
    lys_compile_unres_depset_erase(ctx, unres);
    return ret;
}